

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

pointer __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::
MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::Node>
::allocate(MapAllocator<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::Node>
           *this,size_type n,void *param_3)

{
  ulong n_00;
  unsigned_long uVar1;
  LogMessage *other;
  long in_RSI;
  long *in_RDI;
  size_t n_1;
  LogMessage *in_stack_fffffffffffffeb8;
  LogMessage *in_stack_fffffffffffffec0;
  LogMessage *in_stack_fffffffffffffec8;
  LogMessage *in_stack_fffffffffffffed0;
  Arena *this_00;
  ArenaImpl *in_stack_fffffffffffffee0;
  pointer local_d8;
  pointer local_70;
  LogMessage local_48;
  ulong local_10;
  Arena *local_8;
  
  if (*in_RDI == 0) {
    local_d8 = (pointer)operator_new(in_RSI << 5);
  }
  else {
    this_00 = (Arena *)*in_RDI;
    n_00 = in_RSI << 5;
    uVar1 = std::numeric_limits<unsigned_long>::max();
    if (uVar1 < n_00) {
      internal::LogMessage::LogMessage
                (in_stack_fffffffffffffed0,
                 (LogLevel_conflict)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      internal::LogMessage::operator<<(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      internal::LogMessage::operator<<(in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
      internal::LogFinisher::operator=
                ((LogFinisher *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
      internal::LogMessage::~LogMessage((LogMessage *)0x43f16f);
    }
    if (this_00 == (Arena *)0x0) {
      local_70 = (pointer)operator_new__(n_00);
    }
    else {
      local_10 = n_00;
      local_8 = this_00;
      uVar1 = std::numeric_limits<unsigned_long>::max();
      if (uVar1 < n_00) {
        in_stack_fffffffffffffec0 = &local_48;
        internal::LogMessage::LogMessage
                  ((LogMessage *)this_00,
                   (LogLevel_conflict)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                   (char *)in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20)
                  );
        in_stack_fffffffffffffec8 =
             internal::LogMessage::operator<<
                       (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        other = internal::LogMessage::operator<<
                          (in_stack_fffffffffffffec0,(char *)in_stack_fffffffffffffeb8);
        internal::LogFinisher::operator=((LogFinisher *)in_stack_fffffffffffffec0,other);
        internal::LogMessage::~LogMessage((LogMessage *)0x43f2ae);
      }
      internal::AlignUpTo8(local_10);
      Arena::AllocHook(this_00,(type_info *)in_stack_fffffffffffffec8,
                       (size_t)in_stack_fffffffffffffec0);
      local_70 = (pointer)internal::ArenaImpl::AllocateAligned(in_stack_fffffffffffffee0,n_00);
    }
    local_d8 = local_70;
  }
  return local_d8;
}

Assistant:

pointer allocate(size_type n, const void* /* hint */ = 0) {
      // If arena is not given, malloc needs to be called which doesn't
      // construct element object.
      if (arena_ == NULL) {
        return static_cast<pointer>(::operator new(n * sizeof(value_type)));
      } else {
        return reinterpret_cast<pointer>(
            Arena::CreateArray<uint8>(arena_, n * sizeof(value_type)));
      }
    }